

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_array.h
# Opt level: O2

void __thiscall
v_hashmap<unsigned_char_*,_Search::scored_action>::put_after_get_nogrow
          (v_hashmap<unsigned_char_*,_Search::scored_action> *this,uchar **key,uint64_t hash,
          scored_action *val)

{
  (this->dat)._begin[this->last_position].occupied = true;
  (this->dat)._begin[this->last_position].key = *key;
  (this->dat)._begin[this->last_position].val = *val;
  (this->dat)._begin[this->last_position].hash = hash;
  return;
}

Assistant:

T& operator[](size_t i) const { return _begin[i]; }